

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_archive.cpp
# Opt level: O2

void __thiscall myEmployeeBoss::ArchiveOUT(myEmployeeBoss *this,ChArchiveOut *marchive)

{
  ChNameValue<myEmployee> local_48;
  ChNameValue<bool> local_30;
  
  chrono::ChArchiveOut::VersionWrite<myEmployeeBoss>(marchive);
  myEmployee::ArchiveOUT(&this->super_myEmployee,marchive);
  local_30._value = &this->is_dumb;
  local_30._name = "is_dumb";
  local_30._flags = '\0';
  chrono::ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = &this->slave;
  local_48._name = "slave";
  local_48._flags = '\0';
  chrono::ChArchiveOut::operator<<(marchive,&local_48);
  return;
}

Assistant:

virtual void ArchiveOUT(ChArchiveOut& marchive)  //##### for Chrono serialization
    {
        // suggested: use versioning
        marchive.VersionWrite<myEmployeeBoss>();
        // remember to serialize the parent class data too!!!
        myEmployee::ArchiveOUT(marchive);

        // stream out member data
        marchive << CHNVP(is_dumb);
        marchive << CHNVP(slave);  // this added only from version >1
    }